

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509write_crt.c
# Opt level: O0

int mbedtls_x509write_crt_set_basic_constraints
              (mbedtls_x509write_cert *ctx,int is_ca,int max_pathlen)

{
  long lVar1;
  size_t val_len;
  size_t local_40;
  size_t len;
  uchar *c;
  uchar buf [9];
  int ret;
  int max_pathlen_local;
  int is_ca_local;
  mbedtls_x509write_cert *ctx_local;
  
  len = (size_t)(buf + 1);
  local_40 = 0;
  buf._5_4_ = max_pathlen;
  memset((void *)((long)&c + 3),0,9);
  if ((is_ca == 0) || ((int)buf._5_4_ < 0x80)) {
    if (is_ca != 0) {
      if (-1 < (int)buf._5_4_) {
        buf._1_4_ = mbedtls_asn1_write_int((uchar **)&len,(uchar *)((long)&c + 3),buf._5_4_);
        if ((int)buf._1_4_ < 0) {
          return buf._1_4_;
        }
        local_40 = (size_t)(int)buf._1_4_;
      }
      buf._1_4_ = mbedtls_asn1_write_bool((uchar **)&len,(uchar *)((long)&c + 3),1);
      if ((int)buf._1_4_ < 0) {
        return buf._1_4_;
      }
      local_40 = (long)(int)buf._1_4_ + local_40;
    }
    buf._1_4_ = mbedtls_asn1_write_len((uchar **)&len,(uchar *)((long)&c + 3),local_40);
    ctx_local._4_4_ = buf._1_4_;
    if (-1 < (int)buf._1_4_) {
      lVar1 = (long)(int)buf._1_4_;
      buf._1_4_ = mbedtls_asn1_write_tag((uchar **)&len,(uchar *)((long)&c + 3),'0');
      ctx_local._4_4_ = buf._1_4_;
      if (-1 < (int)buf._1_4_) {
        val_len = (long)(int)buf._1_4_ + lVar1 + local_40;
        ctx_local._4_4_ =
             mbedtls_x509write_crt_set_extension(ctx,"U\x1d\x13",3,0,buf + (1 - val_len),val_len);
      }
    }
  }
  else {
    ctx_local._4_4_ = -0x2800;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_x509write_crt_set_basic_constraints( mbedtls_x509write_cert *ctx,
                                         int is_ca, int max_pathlen )
{
    int ret;
    unsigned char buf[9];
    unsigned char *c = buf + sizeof(buf);
    size_t len = 0;

    memset( buf, 0, sizeof(buf) );

    if( is_ca && max_pathlen > 127 )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    if( is_ca )
    {
        if( max_pathlen >= 0 )
        {
            MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_int( &c, buf, max_pathlen ) );
        }
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_bool( &c, buf, 1 ) );
    }

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                MBEDTLS_ASN1_SEQUENCE ) );

    return mbedtls_x509write_crt_set_extension( ctx, MBEDTLS_OID_BASIC_CONSTRAINTS,
                                        MBEDTLS_OID_SIZE( MBEDTLS_OID_BASIC_CONSTRAINTS ),
                                        0, buf + sizeof(buf) - len, len );
}